

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int parse_7zip_uint64(archive_read *a,uint64_t *val)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  pbVar3 = header_bytes(a,1);
  if (pbVar3 == (byte *)0x0) {
    iVar2 = -1;
  }
  else {
    bVar1 = *pbVar3;
    *val = 0;
    uVar5 = 0x80;
    uVar4 = 0;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
      if ((uVar5 & bVar1) == 0) {
        *val = uVar4 + (long)(int)((uVar5 - 1 & (uint)bVar1) << ((byte)lVar6 & 0x1f));
        break;
      }
      pbVar3 = header_bytes(a,1);
      if (pbVar3 == (byte *)0x0) {
        return -1;
      }
      uVar4 = (ulong)*pbVar3 << ((byte)lVar6 & 0x3f) | *val;
      *val = uVar4;
      uVar5 = uVar5 >> 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
parse_7zip_uint64(struct archive_read *a, uint64_t *val)
{
	const unsigned char *p;
	unsigned char avail, mask;
	int i;

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	avail = *p;
	mask = 0x80;
	*val = 0;
	for (i = 0; i < 8; i++) {
		if (avail & mask) {
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			*val |= ((uint64_t)*p) << (8 * i);
			mask >>= 1;
			continue;
		}
		*val += (avail & (mask -1)) << (8 * i);
		break;
	}
	return (0);
}